

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

GCtab * newtab(lua_State *L,uint32_t asize,uint32_t hbits)

{
  int iVar1;
  GCtab *pGVar2;
  void *pvVar3;
  MSize in_EDX;
  uint in_ESI;
  void *in_RDI;
  GCtab *t;
  Node *node;
  uint32_t hsize;
  MSize size;
  lua_State *in_stack_ffffffffffffffe0;
  
  size = (MSize)((ulong)in_RDI >> 0x20);
  if ((in_ESI == 0) || (0x10 < in_ESI)) {
    pGVar2 = (GCtab *)lj_mem_newgco(in_stack_ffffffffffffffe0,size);
    pGVar2->gct = '\v';
    pGVar2->nomm = 0xff;
    pGVar2->colo = '\0';
    (pGVar2->array).ptr32 = 0;
    (pGVar2->metatable).gcptr32 = 0;
    pGVar2->asize = 0;
    pGVar2->hmask = 0;
    (pGVar2->node).ptr32 = *(int *)((long)in_RDI + 8) + 0x68;
    if (in_ESI != 0) {
      if (0x8000001 < in_ESI) {
        lj_err_msg((lua_State *)CONCAT44(in_ESI,in_EDX),(ErrMsg)((ulong)pGVar2 >> 0x20));
      }
      pvVar3 = lj_mem_realloc(in_stack_ffffffffffffffe0,in_RDI,in_ESI,in_EDX);
      (pGVar2->array).ptr32 = (uint32_t)pvVar3;
      pGVar2->asize = in_ESI;
    }
  }
  else {
    pGVar2 = (GCtab *)lj_mem_newgco(in_stack_ffffffffffffffe0,size);
    pGVar2->gct = '\v';
    pGVar2->nomm = 0xff;
    pGVar2->colo = (int8_t)in_ESI;
    (pGVar2->array).ptr32 = (int)pGVar2 + 0x20;
    (pGVar2->metatable).gcptr32 = 0;
    pGVar2->asize = in_ESI;
    pGVar2->hmask = 0;
    (pGVar2->node).ptr32 = *(int *)((long)in_RDI + 8) + 0x68;
  }
  if (in_EDX != 0) {
    if (0x1a < in_EDX) {
      lj_err_msg((lua_State *)CONCAT44(in_ESI,in_EDX),(ErrMsg)((ulong)pGVar2 >> 0x20));
    }
    iVar1 = 1 << ((byte)in_EDX & 0x1f);
    pvVar3 = lj_mem_realloc(in_stack_ffffffffffffffe0,in_RDI,in_ESI,in_EDX);
    *(uint32_t *)((long)pvVar3 + 0x14) = (uint32_t)pvVar3 + iVar1 * 0x18;
    (pGVar2->node).ptr32 = (uint32_t)pvVar3;
    pGVar2->hmask = iVar1 - 1;
  }
  return pGVar2;
}

Assistant:

static GCtab *newtab(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t;
  /* First try to colocate the array part. */
  if (LJ_MAX_COLOSIZE != 0 && asize > 0 && asize <= LJ_MAX_COLOSIZE) {
    lua_assert((sizeof(GCtab) & 7) == 0);
    t = (GCtab *)lj_mem_newgco(L, sizetabcolo(asize));
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = (int8_t)asize;
    setmref(t->array, (TValue *)((char *)t + sizeof(GCtab)));
    setgcrefnull(t->metatable);
    t->asize = asize;
    t->hmask = 0;
    setmref(t->node, &G(L)->nilnode);
  } else {  /* Otherwise separately allocate the array part. */
    t = lj_mem_newobj(L, GCtab);
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = 0;
    setmref(t->array, NULL);
    setgcrefnull(t->metatable);
    t->asize = 0;  /* In case the array allocation fails. */
    t->hmask = 0;
    setmref(t->node, &G(L)->nilnode);
    if (asize > 0) {
      if (asize > LJ_MAX_ASIZE)
	lj_err_msg(L, LJ_ERR_TABOV);
      setmref(t->array, lj_mem_newvec(L, asize, TValue));
      t->asize = asize;
    }
  }
  if (hbits)
    newhpart(L, t, hbits);
  return t;
}